

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

TapBranch * __thiscall
cfd::core::TapBranch::ChangeTapLeaf
          (TapBranch *__return_storage_ptr__,TapBranch *this,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  unsigned_long *puVar1;
  bool bVar2;
  pointer pTVar3;
  pointer pBVar4;
  CfdException *pCVar5;
  pointer pBVar6;
  ulong uVar7;
  ByteData256 *node;
  pointer object;
  TapBranch *this_00;
  long lVar8;
  ulong uVar9;
  long lVar10;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> target_branch_indexes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> checked_nodes_size_list;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> reverse_nodes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> branch_nodes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> new_branches;
  string check_nodes_str;
  string reverse_nodes_str;
  string hex;
  undefined1 *local_228;
  unsigned_long local_220;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_218;
  unsigned_long *local_1f8;
  iterator iStack_1f0;
  unsigned_long *local_1e8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  Script *local_1b8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1b0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_198;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_180;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_168;
  TapBranch *local_148;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [6];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  TapBranch local_a8;
  
  local_1e0 = target_nodes;
  local_1b8 = tapscript;
  bVar2 = IsFindTapScript(this,tapscript);
  if (!bVar2) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_140._0_8_ = local_130;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,"This tapscript not exist in this tree.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_140);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (*this->_vptr_TapBranch[4])(&local_180,this);
  if ((this->has_leaf_ == true) && (bVar2 = Script::Equals(&this->script_,local_1b8), bVar2)) {
    pBVar6 = (local_1e0->
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pBVar4 = (local_1e0->
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pBVar6 != pBVar4) {
      object = local_180.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)pBVar4 - (long)pBVar6 !=
          (long)local_180.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_180.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start) goto LAB_0035ca1f;
      do {
        bVar2 = ByteData256::operator==(pBVar6,object);
        if (!bVar2) goto LAB_0035ca1f;
        pBVar6 = pBVar6 + 1;
        object = object + 1;
      } while (pBVar6 != pBVar4);
    }
    TapBranch(__return_storage_ptr__,this);
  }
  else {
LAB_0035ca1f:
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              (&local_1b0,local_1e0);
    local_148 = __return_storage_ptr__;
    if (local_1b0.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1b0.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_c8 = local_b8;
      local_c0 = 0;
      local_b8[0] = 0;
    }
    else {
      ::std::
      __reverse<__gnu_cxx::__normal_iterator<cfd::core::ByteData256*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>>
                ();
      pBVar6 = local_1b0.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_c8 = local_b8;
      local_c0 = 0;
      local_b8[0] = 0;
      if (local_1b0.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_1b0.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar4 = local_1b0.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          ByteData256::GetHex_abi_cxx11_((string *)local_140,pBVar4);
          ::std::__cxx11::string::_M_append((char *)&local_c8,local_140._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._0_8_ != local_130) {
            operator_delete((void *)local_140._0_8_);
          }
          pBVar4 = pBVar4 + 1;
        } while (pBVar4 != pBVar6);
      }
    }
    local_228 = local_b8;
    local_1f8 = (unsigned_long *)0x0;
    iStack_1f0._M_current = (unsigned_long *)0x0;
    local_1e8 = (unsigned_long *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_168.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_start = (TapBranch *)0x0;
    local_168.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_finish = (TapBranch *)0x0;
    local_220 = 0;
    pTVar3 = (this->branch_list_).
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->branch_list_).
        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar3) {
      do {
        this_00 = pTVar3 + local_220;
        bVar2 = IsFindTapScript(this_00,local_1b8);
        if (bVar2) {
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_start = (ByteData256 *)0x0;
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_finish = (ByteData256 *)0x0;
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_1b0.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_1b0.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if (iStack_1f0._M_current == local_1e8) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1f8,
                         iStack_1f0,&local_220);
            }
            else {
              *iStack_1f0._M_current = local_220;
              iStack_1f0._M_current = iStack_1f0._M_current + 1;
            }
            local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
            if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<int>
                        (&local_1d8,
                         (iterator)
                         local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(int *)local_140);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            (*this_00->_vptr_TapBranch[4])(&local_198,this_00);
            uVar7 = ((long)local_180.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_180.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            lVar10 = (long)local_180.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_180.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              uVar7 = uVar7 - 1;
              if (uVar7 <= local_220) break;
              ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
              emplace_back<cfd::core::ByteData256&>
                        ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                         &local_218,
                         (ByteData256 *)
                         ((long)&local_180.
                                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10));
              lVar10 = lVar10 + -0x18;
            }
            if (local_220 == 0) {
              GetBaseHash((ByteData256 *)local_140,this);
              ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
              emplace_back<cfd::core::ByteData256>(&local_218,(ByteData256 *)local_140);
            }
            else {
              GetBranchHash((ByteData256 *)local_140,this,(char)local_220 + 0xff);
              ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
              emplace_back<cfd::core::ByteData256>(&local_218,(ByteData256 *)local_140);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_140._0_8_);
            }
            pBVar6 = local_218.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_140._0_8_ = local_130;
            local_140._8_8_ = (pointer)0x0;
            local_130[0]._M_local_buf[0] = '\0';
            pBVar4 = local_218.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_218.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_218.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                ByteData256::GetHex_abi_cxx11_((string *)&local_a8,pBVar4);
                ::std::__cxx11::string::_M_append((char *)local_140,(ulong)local_a8._vptr_TapBranch)
                ;
                if ((Script *)local_a8._vptr_TapBranch != &local_a8.script_) {
                  operator_delete(local_a8._vptr_TapBranch);
                }
                pBVar4 = pBVar4 + 1;
              } while (pBVar4 != pBVar6);
              pBVar4 = local_218.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (local_218.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_218.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar10 = 0;
                uVar7 = 0;
                do {
                  bVar2 = ByteData256::Equals((ByteData256 *)
                                              ((long)&((local_1b0.
                                                                                                                
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar10
                                              ),(ByteData256 *)
                                                ((long)&((local_218.
                                                                                                                    
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar10
                                                ));
                  if (!bVar2) goto LAB_0035cdb1;
                  uVar7 = uVar7 + 1;
                  lVar10 = lVar10 + 0x18;
                  pBVar4 = local_218.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                } while (uVar7 < (ulong)(((long)local_218.
                                                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_218.
                                                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                        -0x5555555555555555));
              }
            }
            if (iStack_1f0._M_current == local_1e8) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1f8,
                         iStack_1f0,&local_220);
              pBVar4 = local_218.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *iStack_1f0._M_current = local_220;
              iStack_1f0._M_current = iStack_1f0._M_current + 1;
            }
            local_a8._vptr_TapBranch =
                 (_func_int **)
                 (((long)pBVar4 -
                   (long)local_218.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
            if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_1d8,
                         (iterator)
                         local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_a8._vptr_TapBranch;
              local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
LAB_0035cdb1:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._0_8_ != local_130) {
              operator_delete((void *)local_140._0_8_);
            }
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                      (&local_198);
          }
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_218);
        }
        local_220 = local_220 + 1;
        pTVar3 = (this->branch_list_).
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (local_220 <
               (ulong)(((long)(this->branch_list_).
                              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                      -0x1111111111111111));
      if (iStack_1f0._M_current != local_1f8) {
        uVar7 = 0;
        do {
          puVar1 = local_1f8;
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_start = (ByteData256 *)0x0;
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_finish = (ByteData256 *)0x0;
          local_218.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pBVar6 = (local_1e0->
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pBVar4 = (local_1e0->
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if ((pBVar6 != pBVar4) &&
             (lVar10 = ((long)pBVar4 - (long)pBVar6 >> 3) * -0x5555555555555555 -
                       local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar7], lVar10 != 0)) {
            lVar8 = 0;
            do {
              ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
              emplace_back<cfd::core::ByteData256_const&>
                        ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                         &local_218,
                         (ByteData256 *)
                         ((long)&(((local_1e0->
                                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar8));
              lVar8 = lVar8 + 0x18;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          ChangeTapLeaf((TapBranch *)local_140,
                        (this->branch_list_).
                        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                        ._M_impl.super__Vector_impl_data._M_start + puVar1[uVar7],local_1b8,
                        &local_218);
          GetBaseHash((ByteData256 *)&local_a8,(TapBranch *)local_140);
          bVar2 = ByteData256::IsEmpty((ByteData256 *)&local_a8);
          if (local_a8._vptr_TapBranch != (_func_int **)0x0) {
            operator_delete(local_a8._vptr_TapBranch);
          }
          if (!bVar2) {
            TapBranch(&local_a8,this);
            local_198.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_198.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_198.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar1[uVar7] != 0) {
              lVar10 = 0;
              uVar9 = 0;
              do {
                ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
                emplace_back<cfd::core::TapBranch_const&>
                          ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
                           &local_198,
                           (TapBranch *)
                           ((long)&((this->branch_list_).
                                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_TapBranch +
                           lVar10));
                uVar9 = uVar9 + 1;
                lVar10 = lVar10 + 0x78;
              } while (uVar9 < puVar1[uVar7]);
            }
            ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
                      (&local_a8.branch_list_,
                       (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                       &local_198);
            AddBranch((TapBranch *)local_140,&local_a8);
            uVar9 = puVar1[uVar7];
            lVar10 = uVar9 * 0x78;
            while( true ) {
              uVar9 = uVar9 + 1;
              pTVar3 = (this->branch_list_).
                       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(this->branch_list_).
                                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                         -0x1111111111111111) <= uVar9) break;
              AddBranch((TapBranch *)local_140,
                        (TapBranch *)((long)&pTVar3[1]._vptr_TapBranch + lVar10));
              lVar10 = lVar10 + 0x78;
            }
            ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
            emplace_back<cfd::core::TapBranch&>
                      ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
                       &local_168,(TapBranch *)local_140);
            ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                      ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                       &local_198);
            ~TapBranch(&local_a8);
          }
          ~TapBranch((TapBranch *)local_140);
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_218);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)iStack_1f0._M_current - (long)local_1f8 >> 3));
      }
    }
    __return_storage_ptr__ = local_148;
    if (local_168.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_168.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_140._0_8_ = local_130;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,"The specified tapscript does not exist under this branch.","")
      ;
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_140);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    TapBranch(local_148,
              local_168.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_start);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_168);
    if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8 != (unsigned_long *)0x0) {
      operator_delete(local_1f8);
    }
    if (local_c8 != local_228) {
      operator_delete(local_c8);
    }
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_1b0);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_180);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::ChangeTapLeaf(
    const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) const {
  if (!IsFindTapScript(tapscript)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "This tapscript not exist in this tree.");
  }
  auto nodes = GetNodeList();
  if (has_leaf_ && script_.Equals(tapscript)) {
    if (target_nodes.empty() || (target_nodes == nodes)) return *this;
  }

  auto reverse_nodes = target_nodes;
  if (!reverse_nodes.empty()) {
    std::reverse(reverse_nodes.begin(), reverse_nodes.end());
  }
  std::string reverse_nodes_str;
  for (const auto& node : reverse_nodes) reverse_nodes_str += node.GetHex();

  std::vector<size_t> target_branch_indexes;
  std::vector<size_t> checked_nodes_size_list;

  std::vector<TapBranch> new_branches;
  for (size_t index = 0; index < branch_list_.size(); ++index) {
    const auto& branch = branch_list_[index];
    if (branch.IsFindTapScript(tapscript)) {
      std::vector<ByteData256> check_nodes;
      if (reverse_nodes.empty()) {
        target_branch_indexes.emplace_back(index);
        checked_nodes_size_list.emplace_back(0);
      } else {
        auto branch_nodes = branch.GetNodeList();
        for (size_t idx = nodes.size() - 1; idx > index; --idx) {
          check_nodes.emplace_back(nodes[idx]);
        }
        if (index == 0) {
          check_nodes.emplace_back(GetBaseHash());
        } else {
          check_nodes.emplace_back(
              GetBranchHash(static_cast<uint8_t>(index - 1)));
        }

        std::string check_nodes_str;
        for (const auto& node : check_nodes) {
          auto hex = node.GetHex();
          check_nodes_str += hex;
        }

        bool has_match = true;
        for (size_t idx = 0; idx < check_nodes.size(); ++idx) {
          if (!reverse_nodes[idx].Equals(check_nodes[idx])) {
            has_match = false;
            break;
          }
        }
        if (has_match) {
          target_branch_indexes.emplace_back(index);
          checked_nodes_size_list.emplace_back(check_nodes.size());
        }
      }
    }
  }

  for (size_t index = 0; index < target_branch_indexes.size(); ++index) {
    const auto& target_index = target_branch_indexes[index];
    const auto& checked_size = checked_nodes_size_list[index];
    std::vector<ByteData256> check_nodes;
    if (!target_nodes.empty()) {
      size_t copy_len = target_nodes.size() - checked_size;
      for (size_t idx = 0; idx < copy_len; ++idx) {
        check_nodes.emplace_back(target_nodes[idx]);
      }
    }

    try {
      auto new_branch =
          branch_list_[target_index].ChangeTapLeaf(tapscript, check_nodes);
      // ignore invalid target.
      if (new_branch.GetBaseHash().IsEmpty()) continue;

      auto based_branch = *this;
      std::vector<TapBranch> copy_branches;
      for (size_t idx = 0; idx < target_index; ++idx) {
        copy_branches.emplace_back(branch_list_[idx]);
      }
      based_branch.branch_list_ = copy_branches;

      new_branch.AddBranch(based_branch);
      for (size_t idx = target_index + 1; idx < branch_list_.size(); ++idx) {
        new_branch.AddBranch(branch_list_[idx]);
      }
      new_branches.emplace_back(new_branch);
    } catch (const CfdException&) {
      // target not found
    }
  }
  if (new_branches.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "The specified tapscript does not exist under this branch.");
  }
  return new_branches[0];  // response is top data.
}